

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# striplog_unittest.cc
# Opt level: O0

int main(int param_1,char **argv)

{
  NullStream *pNVar1;
  NullStream local_8c0;
  byte local_751;
  NullStream local_750;
  byte local_5e1;
  NullStream local_5e0;
  undefined1 local_471;
  undefined1 local_470 [7];
  bool flag;
  A local_302;
  char local_301;
  int local_300 [2];
  NullStream local_2f8;
  NullStream local_180;
  char **local_18;
  char **argv_local;
  int param_0_local;
  
  argv_local._4_4_ = 0;
  local_18 = argv;
  argv_local._0_4_ = param_1;
  signal(6,anon_unknown.dwarf_1555::handle_abort);
  fLB::FLAGS_logtostderr = 1;
  google::InitGoogleLogging(*local_18);
  if ((fLB::FLAGS_check_mode & 1) != 0) {
    printf("%s\n","dbg");
    return 0;
  }
  google::NullStream::NullStream(&local_180);
  pNVar1 = google::NullStream::stream(&local_180);
  google::operator<<(pNVar1,(char (*) [17])"TESTMESSAGE INFO");
  google::NullStream::~NullStream(&local_180);
  google::NullStream::NullStream(&local_2f8);
  pNVar1 = google::NullStream::stream(&local_2f8);
  local_300[1] = 2;
  pNVar1 = google::operator<<(pNVar1,local_300 + 1);
  pNVar1 = google::operator<<(pNVar1,(char (*) [10])"something");
  pNVar1 = google::operator<<(pNVar1,(char (*) [20])"TESTMESSAGE WARNING");
  local_300[0] = 1;
  pNVar1 = google::operator<<(pNVar1,local_300);
  local_301 = 'c';
  pNVar1 = google::operator<<(pNVar1,&local_301);
  pNVar1 = google::operator<<(pNVar1,&local_302);
  std::ostream::operator<<(pNVar1,std::endl<char,std::char_traits<char>>);
  google::NullStream::~NullStream(&local_2f8);
  google::NullStream::NullStream((NullStream *)local_470);
  pNVar1 = google::NullStream::stream((NullStream *)local_470);
  google::operator<<(pNVar1,(char (*) [18])"TESTMESSAGE ERROR");
  google::NullStream::~NullStream((NullStream *)local_470);
  local_471 = 1;
  local_5e1 = 0;
  local_751 = 0;
  google::NullStream::NullStream(&local_5e0);
  local_5e1 = 1;
  pNVar1 = google::NullStream::stream(&local_5e0);
  google::operator<<(pNVar1,(char (*) [17])"TESTMESSAGE COND");
  if ((local_751 & 1) != 0) {
    google::NullStream::~NullStream(&local_750);
  }
  if ((local_5e1 & 1) != 0) {
    google::NullStream::~NullStream(&local_5e0);
  }
  memset(&local_8c0,0,0x168);
  google::NullStreamFatal::NullStreamFatal((NullStreamFatal *)&local_8c0);
  pNVar1 = google::NullStream::stream(&local_8c0);
  google::operator<<(pNVar1,(char (*) [18])"TESTMESSAGE FATAL");
  google::NullStreamFatal::~NullStreamFatal((NullStreamFatal *)&local_8c0);
}

Assistant:

int main(int, char* argv[]) {
#if defined(_MSC_VER)
  // Avoid presenting an interactive dialog that will cause the test to time
  // out.
  _set_abort_behavior(0, _WRITE_ABORT_MSG | _CALL_REPORTFAULT);
#endif  // defined(_MSC_VER)
  std::signal(SIGABRT, handle_abort);

  FLAGS_logtostderr = true;
  InitGoogleLogging(argv[0]);
  if (FLAGS_check_mode) {
    printf("%s\n", DEBUG_MODE ? "dbg" : "opt");
    return 0;
  }
  LOG(INFO) << "TESTMESSAGE INFO";
  LOG(WARNING) << 2 << "something"
               << "TESTMESSAGE WARNING" << 1 << 'c' << A() << std::endl;
  LOG(ERROR) << "TESTMESSAGE ERROR";
  bool flag = true;
  (flag ? LOG(INFO) : LOG(ERROR)) << "TESTMESSAGE COND";
  LOG(FATAL) << "TESTMESSAGE FATAL";
}